

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stat.hpp
# Opt level: O0

int __thiscall libtorrent::aux::stat::stat(stat *this,char *__file,stat *__buf)

{
  int extraout_EAX;
  stat *this_local;
  
  container_wrapper<libtorrent::aux::stat_channel,_long,_std::array<libtorrent::aux::stat_channel,_6UL>_>
  ::container_wrapper(&this->m_stat);
  return extraout_EAX;
}

Assistant:

class TORRENT_EXTRA_EXPORT stat
	{
	public:
		void operator+=(const stat& s)
		{
			for (int i = 0; i < num_channels; ++i)
				m_stat[i] += s.m_stat[i];
		}

		void sent_syn(bool ipv6)
		{
			m_stat[upload_ip_protocol].add(ipv6 ? 60 : 40);
		}

		void received_synack(bool ipv6)
		{
			// we received SYN-ACK and also sent ACK back
			m_stat[download_ip_protocol].add(ipv6 ? 60 : 40);
			m_stat[upload_ip_protocol].add(ipv6 ? 60 : 40);
		}

		void received_bytes(int bytes_payload, int bytes_protocol)
		{
			TORRENT_ASSERT(bytes_payload >= 0);
			TORRENT_ASSERT(bytes_protocol >= 0);

			m_stat[download_payload].add(bytes_payload);
			m_stat[download_protocol].add(bytes_protocol);
		}